

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_rand.c
# Opt level: O3

ares_bool_t ares_init_rand_engine(ares_rand_state *state)

{
  anon_union_272_2_42d3ba2e_for_state *paVar1;
  char *pcVar2;
  ares_bool_t aVar3;
  ares_bool_t aVar4;
  ares_bool_t aVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  byte bVar8;
  uchar swapByte;
  ares_bool_t aVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  ares_timeval_t tv;
  ulong local_70;
  ares_bool_t local_68;
  ares_bool_t local_64;
  ares_bool_t local_60;
  ares_timeval_t local_40;
  
  state->cache_remaining = 0;
  aVar3 = state->bad_backends;
  if ((aVar3 & ARES_TRUE) == ARES_FALSE) {
    state->type = ARES_RAND_OS;
  }
  else {
    if ((aVar3 & 2) == ARES_FALSE) {
      state->type = ARES_RAND_FILE;
      __stream = fopen("/dev/urandom","rb");
      (state->state).rand_file = (FILE *)__stream;
      if (__stream != (FILE *)0x0) {
        aVar3 = setvbuf(__stream,(char *)0x0,2,0);
        return aVar3;
      }
    }
    state->type = ARES_RAND_RC4;
    paVar1 = &state->state;
    local_68 = ares_is_64bit();
    aVar3 = (ares_bool_t)((ulong)paVar1 >> 0x20);
    if (local_68 != ARES_FALSE) {
      local_68 = aVar3;
    }
    local_68 = local_68 | (ares_bool_t)paVar1;
    local_64 = ares_is_64bit();
    aVar9 = (ares_bool_t)((ulong)&local_70 >> 0x20);
    if (local_64 != ARES_FALSE) {
      local_64 = aVar9;
    }
    local_64 = local_64 | (ares_bool_t)&local_70;
    ares_tvnow(&local_40);
    local_60 = local_40.usec | (ares_bool_t)local_40.sec;
    aVar4 = ares_is_64bit();
    aVar5 = ares_is_64bit();
    if (aVar4 == ARES_FALSE) {
      aVar3 = ARES_FALSE;
    }
    if (aVar5 == ARES_FALSE) {
      aVar9 = ARES_FALSE;
    }
    srand(local_40.usec | (ares_bool_t)local_40.sec |
          (ares_bool_t)paVar1 | (ares_bool_t)&local_70 | aVar9 | aVar3);
    local_70 = 0xc;
    do {
      iVar6 = rand();
      *(char *)((long)&local_68 + local_70) = (char)iVar6;
      local_70 = local_70 + 1;
    } while (local_70 < 0x20);
    cVar10 = '\0';
    cVar11 = '\x01';
    cVar12 = '\x02';
    cVar13 = '\x03';
    cVar14 = '\x04';
    cVar15 = '\x05';
    cVar16 = '\x06';
    cVar17 = '\a';
    cVar18 = '\b';
    cVar19 = '\t';
    cVar20 = '\n';
    cVar21 = '\v';
    cVar22 = '\f';
    cVar23 = '\r';
    cVar24 = '\x0e';
    cVar25 = '\x0f';
    lVar7 = 0;
    do {
      pcVar2 = (char *)((long)paVar1 + lVar7);
      *pcVar2 = cVar10;
      pcVar2[1] = cVar11;
      pcVar2[2] = cVar12;
      pcVar2[3] = cVar13;
      pcVar2[4] = cVar14;
      pcVar2[5] = cVar15;
      pcVar2[6] = cVar16;
      pcVar2[7] = cVar17;
      pcVar2[8] = cVar18;
      pcVar2[9] = cVar19;
      pcVar2[10] = cVar20;
      pcVar2[0xb] = cVar21;
      pcVar2[0xc] = cVar22;
      pcVar2[0xd] = cVar23;
      pcVar2[0xe] = cVar24;
      pcVar2[0xf] = cVar25;
      lVar7 = lVar7 + 0x10;
      cVar10 = cVar10 + '\x10';
      cVar11 = cVar11 + '\x10';
      cVar12 = cVar12 + '\x10';
      cVar13 = cVar13 + '\x10';
      cVar14 = cVar14 + '\x10';
      cVar15 = cVar15 + '\x10';
      cVar16 = cVar16 + '\x10';
      cVar17 = cVar17 + '\x10';
      cVar18 = cVar18 + '\x10';
      cVar19 = cVar19 + '\x10';
      cVar20 = cVar20 + '\x10';
      cVar21 = cVar21 + '\x10';
      cVar22 = cVar22 + '\x10';
      cVar23 = cVar23 + '\x10';
      cVar24 = cVar24 + '\x10';
      cVar25 = cVar25 + '\x10';
    } while (lVar7 != 0x100);
    lVar7 = 0;
    bVar8 = 0;
    do {
      cVar10 = *(char *)((long)paVar1 + lVar7);
      bVar8 = bVar8 + cVar10 + *(char *)((long)&local_68 + (ulong)((uint)lVar7 & 0x1f));
      *(undefined1 *)((long)paVar1 + lVar7) = *(undefined1 *)((long)paVar1 + (ulong)bVar8);
      *(char *)((long)paVar1 + (ulong)bVar8) = cVar10;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x100);
    *(undefined1 (*) [16])((long)&state->state + 0x100) = (undefined1  [16])0x0;
    aVar3 = 0x100;
  }
  return aVar3;
}

Assistant:

static ares_bool_t ares_init_rand_engine(ares_rand_state *state)
{
  state->cache_remaining = 0;

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  /* For fuzzing, random should be deterministic */
  state->bad_backends |= ARES_RAND_OS | ARES_RAND_FILE;
#endif

#if defined(HAVE_ARC4RANDOM_BUF) || defined(HAVE_GETRANDOM) || defined(_WIN32)
  if (!(state->bad_backends & ARES_RAND_OS)) {
    state->type = ARES_RAND_OS;
    return ARES_TRUE;
  }
#endif

#if defined(CARES_RANDOM_FILE)
  /* LCOV_EXCL_START: FallbackCode */
  if (!(state->bad_backends & ARES_RAND_FILE)) {
    state->type            = ARES_RAND_FILE;
    state->state.rand_file = fopen(CARES_RANDOM_FILE, "rb");
    if (state->state.rand_file) {
      setvbuf(state->state.rand_file, NULL, _IONBF, 0);
      return ARES_TRUE;
    }
  }
  /* LCOV_EXCL_STOP */

  /* Fall-Thru on failure to RC4 */
#endif

  /* LCOV_EXCL_START: FallbackCode */
  state->type = ARES_RAND_RC4;
  ares_rc4_init(&state->state.rc4);
  /* LCOV_EXCL_STOP */

  /* Currently cannot fail */
  return ARES_TRUE; /* LCOV_EXCL_LINE: UntestablePath */
}